

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O1

int Ver_FindGateInput(Mio_Gate_t *pGate,char *pName)

{
  int iVar1;
  Mio_Pin_t *pPin;
  char *pcVar2;
  Mio_Gate_t *pMVar3;
  uint uVar4;
  
  pPin = Mio_GateReadPins(pGate);
  if (pPin == (Mio_Pin_t *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      pcVar2 = Mio_PinReadName(pPin);
      iVar1 = strcmp(pName,pcVar2);
      if (iVar1 == 0) {
        return uVar4;
      }
      pPin = Mio_PinReadNext(pPin);
      uVar4 = uVar4 + 1;
    } while (pPin != (Mio_Pin_t *)0x0);
  }
  pcVar2 = Mio_GateReadOutName(pGate);
  iVar1 = strcmp(pName,pcVar2);
  if (iVar1 != 0) {
    pMVar3 = Mio_GateReadTwin(pGate);
    if (pMVar3 == (Mio_Gate_t *)0x0) {
      uVar4 = 0xffffffff;
    }
    else {
      pMVar3 = Mio_GateReadTwin(pGate);
      pcVar2 = Mio_GateReadOutName(pMVar3);
      iVar1 = strcmp(pName,pcVar2);
      uVar4 = uVar4 + 1 | -(uint)(iVar1 != 0);
    }
  }
  return uVar4;
}

Assistant:

int Ver_FindGateInput( Mio_Gate_t * pGate, char * pName )
{
    Mio_Pin_t * pGatePin;
    int i;
    for ( i = 0, pGatePin = Mio_GateReadPins(pGate); pGatePin != NULL; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        if ( strcmp(pName, Mio_PinReadName(pGatePin)) == 0 )
            return i;
    if ( strcmp(pName, Mio_GateReadOutName(pGate)) == 0 )
        return i;
    if ( Mio_GateReadTwin(pGate) && strcmp(pName, Mio_GateReadOutName(Mio_GateReadTwin(pGate))) == 0 )
        return i+1;
    return -1;
}